

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O1

string * __thiscall
deqp::egl::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  ostringstream stream;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar2 = *(long *)this;
  if (*(long *)(this + 8) != lVar2) {
    uVar4 = 0;
    do {
      iVar1 = *(int *)(lVar2 + uVar4 * 4);
      if (iVar1 == 0) {
        lVar2 = 5;
        pcVar3 = "clear";
LAB_00e4d4ba:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar2);
      }
      else if (iVar1 == 1) {
        lVar2 = 6;
        pcVar3 = "render";
        goto LAB_00e4d4ba;
      }
      if (uVar4 < (*(long *)(this + 8) - *(long *)this >> 2) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      }
      uVar4 = uVar4 + 1;
      lVar2 = *(long *)this;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - lVar2 >> 2));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string generateTestName (const vector<DrawType>& frameDrawType)
{
	std::ostringstream stream;

	for (size_t ndx = 0; ndx < frameDrawType.size(); ndx++)
	{
		if (frameDrawType[ndx] == DRAWTYPE_GLES2_RENDER)
			stream << "render";
		else if (frameDrawType[ndx] == DRAWTYPE_GLES2_CLEAR)
			stream << "clear";
		else
			DE_ASSERT(false);

		if (ndx < frameDrawType.size()-1)
			stream << "_";
	}

	return stream.str();
}